

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::SummarizeBins
          (BamStandardIndex *this,BaiReferenceSummary *refSummary)

{
  BamReaderPrivate *pBVar1;
  BamStandardIndex *in_RSI;
  int numBins;
  int *in_stack_00000058;
  BamStandardIndex *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  ReadNumBins(in_stack_00000060,in_stack_00000058);
  *(undefined4 *)&(in_RSI->super_BamIndex)._vptr_BamIndex = in_stack_ffffffffffffffec;
  pBVar1 = (BamReaderPrivate *)Tell((BamStandardIndex *)0x1cede7);
  (in_RSI->super_BamIndex).m_reader = pBVar1;
  SkipBins(in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void BamStandardIndex::SummarizeBins(BaiReferenceSummary& refSummary)
{

    // load number of bins
    int numBins;
    ReadNumBins(numBins);

    // store bins summary for this reference
    refSummary.NumBins = numBins;
    refSummary.FirstBinFilePosition = Tell();

    // skip this reference's bins
    SkipBins(numBins);
}